

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[57],char_const*,char[24],unsigned_int,char>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [57],char **RestArgs,char (*RestArgs_1) [24],uint *RestArgs_2,
               char *RestArgs_3)

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,char_const*>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[24],unsigned_int,char>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}